

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

Polynomial<double> *
OpenMD::operator+(Polynomial<double> *__return_storage_ptr__,Polynomial<double> *p1,
                 Polynomial<double> *p2)

{
  _Rb_tree_node_base *p_Var1;
  
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)__return_storage_ptr__,
             (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)p1);
  for (p_Var1 = (p2->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(p2->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Polynomial<double>::addCoefficient
              (__return_storage_ptr__,p_Var1[1]._M_color,(double *)&p_Var1[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

Polynomial<Real> operator+(const Polynomial<Real>& p1,
                             const Polynomial<Real>& p2) {
    Polynomial<Real> p(p1);

    typename Polynomial<Real>::const_iterator i;

    for (i = p2.begin(); i != p2.end(); ++i) {
      p.addCoefficient(i->first, i->second);
    }

    return p;
  }